

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int read_uint64(coda_cursor *cursor,uint64_t *dst)

{
  coda_backend cVar1;
  int iVar2;
  
  cVar1 = (cursor->stack[(long)cursor->n + -1].type)->backend;
  if (99 < (int)cVar1) {
    if (cVar1 == coda_backend_memory) {
      iVar2 = coda_mem_cursor_read_uint64(cursor,dst);
      return iVar2;
    }
    if (cVar1 == coda_backend_hdf4) {
      iVar2 = -0xb;
    }
    else {
      if (cVar1 != coda_backend_hdf5) goto LAB_00126e5f;
      iVar2 = -0xd;
    }
    coda_set_error(iVar2,(char *)0x0);
    return -1;
  }
  if (cVar1 == coda_backend_ascii) {
    iVar2 = coda_ascii_cursor_read_uint64(cursor,dst);
    return iVar2;
  }
  if (cVar1 == coda_backend_binary) {
    iVar2 = coda_bin_cursor_read_uint64(cursor,dst);
    return iVar2;
  }
LAB_00126e5f:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                ,0x25e,"int read_uint64(const coda_cursor *, uint64_t *)");
}

Assistant:

static int read_uint64(const coda_cursor *cursor, uint64_t *dst)
{
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_uint64(cursor, dst);
        case coda_backend_binary:
            return coda_bin_cursor_read_uint64(cursor, dst);
        case coda_backend_memory:
            return coda_mem_cursor_read_uint64(cursor, dst);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_read_uint64(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_read_uint64(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            break;
    }

    assert(0);
    exit(1);
}